

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Utf8Dfa.h
# Opt level: O1

void __thiscall
axl::enc::Utf8ReverseDfa::
emitErrorPendingCus<axl::enc::Convert<axl::enc::Utf32,axl::enc::Utf8,axl::enc::ToCaseFolded,axl::enc::Utf8ReverseDecoder>::EncodingEmitter_s>
          (Utf8ReverseDfa *this,uchar_t c,uint_t nextState,EncodingEmitter_s *emitter,utf8_t *p)

{
  utf32_t uVar1;
  utf32_t *puVar2;
  
  if ((int)nextState < 0xc000028) {
    if (((nextState != 0x6000018) && (nextState != 0x6000058)) && (nextState != 0x60c123b)) {
      return;
    }
    puVar2 = (emitter->super_EncodingEmitter_u).m_p;
    uVar1 = toCaseFolded(this->m_acc & 0x3f | 0x80);
    *puVar2 = uVar1;
    puVar2 = puVar2 + 1;
  }
  else if ((int)nextState < 0x12000048) {
    if ((nextState != 0xc000028) && (nextState != 0xc000068)) {
      return;
    }
    puVar2 = (emitter->super_EncodingEmitter_u).m_p;
    uVar1 = toCaseFolded(this->m_acc & 0x3f | 0x80);
    *puVar2 = uVar1;
    (emitter->super_EncodingEmitter_u).m_p = puVar2 + 1;
    uVar1 = toCaseFolded(this->m_acc >> 6 & 0x3f | 0x80);
    puVar2[1] = uVar1;
    puVar2 = puVar2 + 2;
  }
  else {
    if ((nextState != 0x12000048) && (nextState != 0x12000078)) {
      return;
    }
    puVar2 = (emitter->super_EncodingEmitter_u).m_p;
    uVar1 = toCaseFolded(this->m_acc & 0x3f | 0x80);
    *puVar2 = uVar1;
    (emitter->super_EncodingEmitter_u).m_p = puVar2 + 1;
    uVar1 = toCaseFolded(this->m_acc >> 6 & 0x3f | 0x80);
    puVar2[1] = uVar1;
    (emitter->super_EncodingEmitter_u).m_p = puVar2 + 2;
    uVar1 = toCaseFolded(this->m_acc >> 0xc & 0x3f | 0x80);
    puVar2[2] = uVar1;
    puVar2 = puVar2 + 3;
  }
  (emitter->super_EncodingEmitter_u).m_p = puVar2;
  return;
}

Assistant:

void
	emitErrorPendingCus(
		uchar_t c,
		uint_t nextState,
		Emitter& emitter,
		const utf8_t* p
	) {
		if (isReady(nextState)) {
			// State_Ready_Error_x is only possible for Cc_Ascii (0), Cc_Hdr_2 (2), Cc_Hdr_3 (3)
			// cc >> 1 yields exactly what we need: 0 -> 0, 2 -> 1, 3 -> 2
			uint_t cc = m_map[c];
			p += cc >> 1;
		}

		switch (nextState) {
		case State_Error_1:
		case State_Ready_Error:
			emitter.emitCu(p, 0x80 | (m_acc & 0x3f));
			break;

		case State_Error_2:
		case State_Ready_Error_2:
			emitter.emitCu(p + 1, 0x80 | (m_acc & 0x3f));
			emitter.emitCu(p, 0x80 | ((m_acc >> 6) & 0x3f));
			break;

		case State_Error_3:
		case State_Ready_Error_3:
			emitter.emitCu(p + 2, 0x80 | (m_acc & 0x3f));
			emitter.emitCu(p + 1, 0x80 | ((m_acc >> 6) & 0x3f));
			emitter.emitCu(p, 0x80 | ((m_acc >> 12) & 0x3f));
			break;

		case State_Cb_3_Error:
			emitter.emitCu(p + 2, 0x80 | (m_acc & 0x3f));
			break;
		}
	}